

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

MIR_insn_code_t get_mir_type_insn_code(c2m_ctx_t c2m_ctx,type *type,node_t_conflict r)

{
  MIR_type_t MVar1;
  MIR_insn_code_t MVar2;
  ulong uVar3;
  undefined *puVar4;
  
  MVar1 = get_mir_type(c2m_ctx,type);
  switch(r->code) {
  case N_EQ:
    if (MVar1 - MIR_T_F < 3) {
      MVar2 = MVar1 + 0x42;
    }
    else {
      MVar2 = (MVar1 & 0x1e) == MIR_T_I64 ^ MIR_EQS;
    }
    break;
  case N_NE:
    if (MVar1 - MIR_T_F < 3) {
      MVar2 = MVar1 + 0x47;
    }
    else {
      MVar2 = ((MVar1 & 0x1e) != MIR_T_I64) + MIR_NE;
    }
    break;
  case N_LT:
    if (4 < MVar1 - MIR_T_I64) {
      return (uint)(MVar1 != MIR_T_I32) * 2 + MIR_LTS;
    }
    uVar3 = (ulong)(MVar1 - MIR_T_I64);
    puVar4 = &DAT_0018976c;
    goto LAB_00173305;
  case N_LE:
    if (4 < MVar1 - MIR_T_I64) {
      return (uint)(MVar1 != MIR_T_I32) * 2 + MIR_LES;
    }
    uVar3 = (ulong)(MVar1 - MIR_T_I64);
    puVar4 = &DAT_00189780;
    goto LAB_00173305;
  case N_GT:
    if (4 < MVar1 - MIR_T_I64) {
      return (uint)(MVar1 != MIR_T_I32) * 2 + MIR_GTS;
    }
    uVar3 = (ulong)(MVar1 - MIR_T_I64);
    puVar4 = &DAT_00189794;
    goto LAB_00173305;
  case N_GE:
    if (4 < MVar1 - MIR_T_I64) {
      return (uint)(MVar1 != MIR_T_I32) * 2 + MIR_GES;
    }
    uVar3 = (ulong)(MVar1 - MIR_T_I64);
    puVar4 = &DAT_001897a8;
    goto LAB_00173305;
  default:
    __assert_fail("FALSE",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x2ac0,"MIR_insn_code_t get_mir_type_insn_code(c2m_ctx_t, struct type *, node_t)"
                 );
  case N_AND:
  case N_AND_ASSIGN:
    MVar2 = (MVar1 & 0x1e) == MIR_T_I64 ^ MIR_ANDS;
    break;
  case N_OR:
  case N_OR_ASSIGN:
    MVar2 = (MVar1 & 0x1e) == MIR_T_I64 ^ MIR_ORS;
    break;
  case N_XOR:
  case N_XOR_ASSIGN:
    MVar2 = (MVar1 & 0x1e) == MIR_T_I64 ^ MIR_XORS;
    break;
  case N_LSH:
  case N_LSH_ASSIGN:
    MVar2 = (MVar1 & 0x1e) == MIR_T_I64 ^ MIR_LSHS;
    break;
  case N_RSH:
  case N_RSH_ASSIGN:
    if (MVar1 == MIR_T_I64) {
      MVar2 = MIR_RSH;
    }
    else if (MVar1 == MIR_T_U64) {
      MVar2 = MIR_URSH;
    }
    else {
      MVar2 = (MVar1 != MIR_T_I32) + 0x45 + (uint)(MVar1 != MIR_T_I32);
    }
    break;
  case N_ADD:
  case N_ADD_ASSIGN:
  case N_INC:
  case N_POST_INC:
    if (MVar1 - MIR_T_F < 3) {
      MVar2 = MVar1 + 0x1c;
    }
    else {
      MVar2 = (MVar1 & 0x1e) == MIR_T_I64 ^ MIR_ADDS;
    }
    break;
  case N_SUB:
  case N_SUB_ASSIGN:
  case N_DEC:
  case N_POST_DEC:
    if (MVar1 - MIR_T_F < 3) {
      MVar2 = MVar1 + 0x21;
    }
    else {
      MVar2 = ((MVar1 & 0x1e) != MIR_T_I64) + MIR_SUB;
    }
    break;
  case N_MUL:
  case N_MUL_ASSIGN:
    if (MVar1 - MIR_T_F < 3) {
      MVar2 = MVar1 + 0x26;
    }
    else {
      MVar2 = (MVar1 & 0x1e) == MIR_T_I64 ^ MIR_MULS;
    }
    break;
  case N_DIV:
  case N_DIV_ASSIGN:
    if (4 < MVar1 - MIR_T_I64) {
      return (uint)(MVar1 != MIR_T_I32) * 2 + MIR_DIVS;
    }
    uVar3 = (ulong)(MVar1 - MIR_T_I64);
    puVar4 = &DAT_00189758;
LAB_00173305:
    MVar2 = *(MIR_insn_code_t *)(puVar4 + uVar3 * 4);
    break;
  case N_MOD:
  case N_MOD_ASSIGN:
    if (MVar1 == MIR_T_I64) {
      MVar2 = MIR_MOD;
    }
    else if (MVar1 == MIR_T_U64) {
      MVar2 = MIR_UMOD;
    }
    else {
      MVar2 = (MVar1 != MIR_T_I32) + 0x39 + (uint)(MVar1 != MIR_T_I32);
    }
  }
  return MVar2;
}

Assistant:

static MIR_insn_code_t get_mir_type_insn_code (c2m_ctx_t c2m_ctx, struct type *type, node_t r) {
  MIR_type_t t = get_mir_type (c2m_ctx, type);

  switch (r->code) {
  case N_INC:
  case N_POST_INC:
  case N_ADD:
  case N_ADD_ASSIGN:
    return (t == MIR_T_F                       ? MIR_FADD
            : t == MIR_T_D                     ? MIR_DADD
            : t == MIR_T_LD                    ? MIR_LDADD
            : t == MIR_T_I64 || t == MIR_T_U64 ? MIR_ADD
                                               : MIR_ADDS);
  case N_DEC:
  case N_POST_DEC:
  case N_SUB:
  case N_SUB_ASSIGN:
    return (t == MIR_T_F                       ? MIR_FSUB
            : t == MIR_T_D                     ? MIR_DSUB
            : t == MIR_T_LD                    ? MIR_LDSUB
            : t == MIR_T_I64 || t == MIR_T_U64 ? MIR_SUB
                                               : MIR_SUBS);
  case N_MUL:
  case N_MUL_ASSIGN:
    return (t == MIR_T_F                       ? MIR_FMUL
            : t == MIR_T_D                     ? MIR_DMUL
            : t == MIR_T_LD                    ? MIR_LDMUL
            : t == MIR_T_I64 || t == MIR_T_U64 ? MIR_MUL
                                               : MIR_MULS);
  case N_DIV:
  case N_DIV_ASSIGN:
    return (t == MIR_T_F     ? MIR_FDIV
            : t == MIR_T_D   ? MIR_DDIV
            : t == MIR_T_LD  ? MIR_LDDIV
            : t == MIR_T_I64 ? MIR_DIV
            : t == MIR_T_U64 ? MIR_UDIV
            : t == MIR_T_I32 ? MIR_DIVS
                             : MIR_UDIVS);
  case N_MOD:
  case N_MOD_ASSIGN:
    return (t == MIR_T_I64   ? MIR_MOD
            : t == MIR_T_U64 ? MIR_UMOD
            : t == MIR_T_I32 ? MIR_MODS
                             : MIR_UMODS);
  case N_AND:
  case N_AND_ASSIGN: return (t == MIR_T_I64 || t == MIR_T_U64 ? MIR_AND : MIR_ANDS);
  case N_OR:
  case N_OR_ASSIGN: return (t == MIR_T_I64 || t == MIR_T_U64 ? MIR_OR : MIR_ORS);
  case N_XOR:
  case N_XOR_ASSIGN: return (t == MIR_T_I64 || t == MIR_T_U64 ? MIR_XOR : MIR_XORS);
  case N_LSH:
  case N_LSH_ASSIGN: return (t == MIR_T_I64 || t == MIR_T_U64 ? MIR_LSH : MIR_LSHS);
  case N_RSH:
  case N_RSH_ASSIGN:
    return (t == MIR_T_I64   ? MIR_RSH
            : t == MIR_T_U64 ? MIR_URSH
            : t == MIR_T_I32 ? MIR_RSHS
                             : MIR_URSHS);
  case N_EQ:
    return (t == MIR_T_F                       ? MIR_FEQ
            : t == MIR_T_D                     ? MIR_DEQ
            : t == MIR_T_LD                    ? MIR_LDEQ
            : t == MIR_T_I64 || t == MIR_T_U64 ? MIR_EQ
                                               : MIR_EQS);
  case N_NE:
    return (t == MIR_T_F                       ? MIR_FNE
            : t == MIR_T_D                     ? MIR_DNE
            : t == MIR_T_LD                    ? MIR_LDNE
            : t == MIR_T_I64 || t == MIR_T_U64 ? MIR_NE
                                               : MIR_NES);
  case N_LT:
    return (t == MIR_T_F     ? MIR_FLT
            : t == MIR_T_D   ? MIR_DLT
            : t == MIR_T_LD  ? MIR_LDLT
            : t == MIR_T_I64 ? MIR_LT
            : t == MIR_T_U64 ? MIR_ULT
            : t == MIR_T_I32 ? MIR_LTS
                             : MIR_ULTS);
  case N_LE:
    return (t == MIR_T_F     ? MIR_FLE
            : t == MIR_T_D   ? MIR_DLE
            : t == MIR_T_LD  ? MIR_LDLE
            : t == MIR_T_I64 ? MIR_LE
            : t == MIR_T_U64 ? MIR_ULE
            : t == MIR_T_I32 ? MIR_LES
                             : MIR_ULES);
  case N_GT:
    return (t == MIR_T_F     ? MIR_FGT
            : t == MIR_T_D   ? MIR_DGT
            : t == MIR_T_LD  ? MIR_LDGT
            : t == MIR_T_I64 ? MIR_GT
            : t == MIR_T_U64 ? MIR_UGT
            : t == MIR_T_I32 ? MIR_GTS
                             : MIR_UGTS);
  case N_GE:
    return (t == MIR_T_F     ? MIR_FGE
            : t == MIR_T_D   ? MIR_DGE
            : t == MIR_T_LD  ? MIR_LDGE
            : t == MIR_T_I64 ? MIR_GE
            : t == MIR_T_U64 ? MIR_UGE
            : t == MIR_T_I32 ? MIR_GES
                             : MIR_UGES);
  default: assert (FALSE); return MIR_INSN_BOUND;
  }
}